

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmDefinitions> *this_00;
  _Base_ptr p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  pointer puVar7;
  pointer pPVar8;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar9;
  pointer pcVar10;
  StackIter begin;
  StackIter end;
  StackIter begin_00;
  StackIter end_00;
  cmStateSnapshot *pcVar11;
  PointerType pBVar12;
  PointerType pSVar13;
  string *psVar14;
  PointerType pcVar15;
  string_view value;
  string_view value_00;
  iterator iVar16;
  string binDir;
  iterator it;
  PositionType pos;
  string local_d8;
  string local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  iterator local_68;
  string local_58;
  cmStateSnapshot *local_38;
  
  cmPropertyMap::Clear(&this->GlobalProperties);
  p_Var1 = (_Base_ptr)(local_98 + 8);
  local_88._0_8_ = (_Base_ptr)0x0;
  local_98 = ZEXT816(0);
  local_88._24_8_ = 0;
  local_88._8_8_ = p_Var1;
  local_88._16_8_ = p_Var1;
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  ::clear((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
           *)this);
  if ((_Base_ptr)local_88._0_8_ != (_Base_ptr)0x0) {
    (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_98._8_4_;
    (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_88._0_8_;
    (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_88._8_8_;
    (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_88._16_8_;
    *(_Rb_tree_header **)(local_88._0_8_ + 8) =
         &(this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header;
    (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_88._24_8_;
    local_88._0_8_ = (_Base_ptr)0x0;
    local_88._24_8_ = 0;
    local_88._8_8_ = p_Var1;
    local_88._16_8_ = p_Var1;
  }
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
               *)local_98);
  cmGlobVerificationManager::Reset
            ((this->GlobVerificationManager)._M_t.
             super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
             .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl);
  local_68 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  local_98 = (undefined1  [16])
             cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                       (&this->BuildsystemDirectory);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&pBVar12->IncludeDirectories,
                    (pBVar12->IncludeDirectories).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&pBVar12->CompileDefinitions,
                    (pBVar12->CompileDefinitions).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&pBVar12->CompileOptions,
                    (pBVar12->CompileOptions).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&pBVar12->LinkOptions,
                    (pBVar12->LinkOptions).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&pBVar12->LinkDirectories,
                    (pBVar12->LinkDirectories).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  (pBVar12->CurrentScope).Tree = local_68.Tree;
  (pBVar12->CurrentScope).Position = local_68.Position;
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar12->NormalTargetNames,
                    (pBVar12->NormalTargetNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar12->ImportedTargetNames,
                    (pBVar12->ImportedTargetNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  cmPropertyMap::Clear(&pBVar12->Properties);
  pBVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_98);
  pcVar6 = (pBVar12->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pBVar12->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar6) {
    (pBVar12->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar6;
  }
  puVar7 = (this->PolicyStack).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->PolicyStack).UpPositions.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (this->PolicyStack).UpPositions.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  pcVar9 = &this->PolicyStack;
  pPVar8 = (this->PolicyStack).Data.
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->PolicyStack).Data.
      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar8) {
    (this->PolicyStack).Data.
    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar8;
  }
  pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
  (pSVar13->Policies).Tree = pcVar9;
  (pSVar13->Policies).Position = 0;
  pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
  (pSVar13->PolicyRoot).Tree = pcVar9;
  (pSVar13->PolicyRoot).Position = 0;
  pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
  (pSVar13->PolicyScope).Tree = pcVar9;
  (pSVar13->PolicyScope).Position = 0;
  pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
  pcVar9 = (pSVar13->Policies).Tree;
  if ((pcVar9 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
     ((pSVar13->Policies).Position <=
      (ulong)((long)(pcVar9->Data).
                    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pcVar9->Data).
                    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6))) {
    pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
    pcVar9 = (pSVar13->PolicyRoot).Tree;
    if ((pcVar9 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
       ((pSVar13->PolicyRoot).Position <=
        (ulong)((long)(pcVar9->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pcVar9->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6))) {
      paVar2 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_SOURCE_DIR","");
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      begin.Tree = (pSVar13->Vars).Tree;
      begin.Position = (pSVar13->Vars).Position;
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      end.Tree = (pSVar13->Root).Tree;
      end.Position = (pSVar13->Root).Position;
      psVar14 = (string *)cmDefinitions::Get(&local_b8,begin,end);
      if (psVar14 == (string *)0x0) {
        psVar14 = &cmValue::Empty_abi_cxx11_;
      }
      local_98._0_8_ =
           (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_98 + 0x10);
      pcVar10 = (psVar14->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar10,pcVar10 + psVar14->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_d8.field_2;
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_BINARY_DIR","");
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      begin_00.Tree = (pSVar13->Vars).Tree;
      begin_00.Position = (pSVar13->Vars).Position;
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      end_00.Tree = (pSVar13->Root).Tree;
      end_00.Position = (pSVar13->Root).Position;
      psVar14 = (string *)cmDefinitions::Get(&local_d8,begin_00,end_00);
      if (psVar14 == (string *)0x0) {
        psVar14 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar10 = (psVar14->_M_dataplus)._M_p;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar10,pcVar10 + psVar14->_M_string_length);
      local_38 = __return_storage_ptr__;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      this_00 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_00);
      iVar16.Position = 0;
      iVar16.Tree = this_00;
      iVar16 = cmLinkedTree<cmDefinitions>::Push(this_00,iVar16);
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      pSVar13->Vars = iVar16;
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      (pSVar13->Parent).Tree = this_00;
      (pSVar13->Parent).Position = 0;
      pcVar4 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_98 + 0x10);
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      (pSVar13->Root).Tree = this_00;
      (pSVar13->Root).Position = 0;
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      pcVar15 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar13->Vars);
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_SOURCE_DIR","");
      value._M_str = (char *)local_98._0_8_;
      value._M_len = local_98._8_8_;
      cmDefinitions::Set(pcVar15,&local_d8,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      pSVar13 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
      pcVar15 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar13->Vars);
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_BINARY_DIR","");
      value_00._M_str = local_b8._M_dataplus._M_p;
      value_00._M_len = local_b8._M_string_length;
      cmDefinitions::Set(pcVar15,&local_d8,value_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      local_98._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RULE_LAUNCH_COMPILE","");
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      paVar5 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)local_98,DIRECTORY,&local_b8,&local_d8,true,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      local_98._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RULE_LAUNCH_LINK","");
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)local_98,DIRECTORY,&local_b8,&local_d8,true,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      local_98._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RULE_LAUNCH_CUSTOM","");
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)local_98,DIRECTORY,&local_b8,&local_d8,true,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      local_98._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RULE_LAUNCH_COMPILE","");
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)local_98,TARGET,&local_b8,&local_d8,true,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      local_98._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RULE_LAUNCH_LINK","");
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)local_98,TARGET,&local_b8,&local_d8,true,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      local_98._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RULE_LAUNCH_CUSTOM","");
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_d8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)local_98,TARGET,&local_b8,&local_d8,true,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != pcVar4) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      pcVar11 = local_38;
      cmStateSnapshot::cmStateSnapshot(local_38,this,local_68);
      return pcVar11;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x128,"cmStateSnapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x127,"cmStateSnapshot cmState::Reset()");
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.Clear();
  this->PropertyDefinitions = {};
  this->GlobVerificationManager->Reset();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->CompileDefinitions.clear();
    it->CompileOptions.clear();
    it->LinkOptions.clear();
    it->LinkDirectories.clear();
    it->CurrentScope = pos;
    it->NormalTargetNames.clear();
    it->ImportedTargetNames.clear();
    it->Properties.Clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      *cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      *cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir);
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir);
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return { this, pos };
}